

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCatalogDump(void)

{
  int iVar1;
  int iVar2;
  FILE *val;
  int local_1c;
  int n_out;
  FILE *out;
  int mem_base;
  int test_ret;
  
  out._4_4_ = 0;
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    iVar1 = xmlMemBlocks();
    val = gen_FILE_ptr(local_1c,0);
    xmlCatalogDump(val);
    call_tests = call_tests + 1;
    des_FILE_ptr(local_1c,val,0);
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCatalogDump",(ulong)(uint)(iVar2 - iVar1));
      out._4_4_ = out._4_4_ + 1;
      printf(" %d");
      printf("\n");
    }
  }
  function_tests = function_tests + 1;
  return out._4_4_;
}

Assistant:

static int
test_xmlCatalogDump(void) {
    int test_ret = 0;

#if defined(LIBXML_CATALOG_ENABLED) && defined(LIBXML_OUTPUT_ENABLED)
    int mem_base;
    FILE * out; /* the file. */
    int n_out;

    for (n_out = 0;n_out < gen_nb_FILE_ptr;n_out++) {
        mem_base = xmlMemBlocks();
        out = gen_FILE_ptr(n_out, 0);

        xmlCatalogDump(out);
        call_tests++;
        des_FILE_ptr(n_out, out, 0);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCatalogDump",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_out);
            printf("\n");
        }
    }
    function_tests++;
#endif

    return(test_ret);
}